

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall Parser::parse_statements(Parser *this)

{
  ostream *poVar1;
  int iVar2;
  
  poVar1 = (ostream *)this->out_file;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t\t<statements>",0xe);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  iVar2 = Tokenizer::get_keyword_val(this->tokenizer,&this->cur_token);
  while (iVar2 - 9U < 6) {
    query_tokenizer(this);
    switch(iVar2) {
    case 9:
      parse_let_statement(this);
      break;
    case 10:
      parse_if_statement(this);
      break;
    case 0xc:
      parse_while_statement(this);
      break;
    case 0xd:
      parse_return_statement(this);
      break;
    case 0xe:
      parse_do_statement(this);
    }
    iVar2 = Tokenizer::get_keyword_val(this->tokenizer,&this->cur_token);
  }
  poVar1 = (ostream *)this->out_file;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t\t</statements>",0xf);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void Parser::parse_statements() {
    out_file << "\t\t<statements>" << std::endl;

    int keyword = tokenizer.get_keyword_val(cur_token);

    while (keyword >= LET && keyword <= DO) {
        query_tokenizer();

        switch (keyword) {

            case LET:
                parse_let_statement();
                break;

            case IF:
                parse_if_statement();
                break;

            case WHILE:
                parse_while_statement();
                break;

            case RETURN:
                parse_return_statement();
                break;

            case DO:
                parse_do_statement();
                break;
        }
        keyword = tokenizer.get_keyword_val(cur_token);
    }
    out_file << "\t\t</statements>" << std::endl;
}